

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_multi_process_pending_handles(Curl_multi *multi)

{
  SessionHandle *data_00;
  SessionHandle *pSVar1;
  curl_llist_element *next;
  SessionHandle *data;
  curl_llist_element *e;
  Curl_multi *multi_local;
  
  pSVar1 = (SessionHandle *)multi->pending->head;
  while (data = pSVar1, data != (SessionHandle *)0x0) {
    data_00 = data->next;
    pSVar1 = (SessionHandle *)data->easy_conn;
    if (data_00->mstate == CURLM_STATE_CONNECT_PEND) {
      mstate(data_00,CURLM_STATE_CONNECT);
      Curl_llist_remove(multi->pending,(curl_llist_element *)data,(void *)0x0);
      Curl_expire_latest(data_00,1);
    }
  }
  return;
}

Assistant:

void Curl_multi_process_pending_handles(struct Curl_multi *multi)
{
  struct curl_llist_element *e = multi->pending->head;

  while(e) {
    struct SessionHandle *data = e->ptr;
    struct curl_llist_element *next = e->next;

    if(data->mstate == CURLM_STATE_CONNECT_PEND) {
      multistate(data, CURLM_STATE_CONNECT);

      /* Remove this node from the list */
      Curl_llist_remove(multi->pending, e, NULL);

      /* Make sure that the handle will be processed soonish. */
      Curl_expire_latest(data, 1);
    }

    e = next; /* operate on next handle */
  }
}